

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_fkhash_trie.hpp
# Opt level: O1

void __thiscall
poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::plain_fkhash_trie
          (plain_fkhash_trie<90U,_poplar::hash::vigna_hasher> *this,uint32_t capa_bits,
          uint32_t symb_bits)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 in_XMM1 [16];
  compact_vector local_48;
  
  uVar2 = 0x10;
  if (0x10 < capa_bits) {
    uVar2 = (ulong)capa_bits;
  }
  uVar4 = -1L << (uVar2 & 0x3f);
  *(undefined8 *)
   ((long)&(this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&(this->ids_).size_ + 4) = 0;
  *(undefined8 *)((long)&(this->ids_).mask_ + 4) = 0;
  *(undefined8 *)((long)&(this->ids_).width_ + 4) = 0;
  *(undefined8 *)((long)&this->size_ + 4) = 0;
  *(undefined8 *)((long)&this->max_size_ + 4) = 0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->table_).size_ = 0;
  (this->table_).mask_ = 0;
  (this->table_).width_ = 0;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ids_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->capa_size_).bits_ = (uint32_t)uVar2;
  (this->capa_size_).mask_ = ~uVar4;
  (this->symb_size_).bits_ = symb_bits;
  (this->symb_size_).mask_ = ~(-1L << ((ulong)symb_bits & 0x3f));
  auVar1 = vcvtusi2sd_avx512f(in_XMM1,uVar4 * -0x5a);
  auVar5._0_8_ = auVar1._0_8_ / 100.0;
  auVar5._8_8_ = auVar1._8_8_;
  uVar3 = vcvttsd2usi_avx512f(auVar5);
  this->max_size_ = uVar3;
  compact_vector::compact_vector(&local_48,-uVar4,symb_bits + (uint32_t)uVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this,&local_48);
  (this->table_).width_ = local_48.width_;
  (this->table_).size_ = local_48.size_;
  (this->table_).mask_ = local_48.mask_;
  if (local_48.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.chunks_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.chunks_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.chunks_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  compact_vector::compact_vector(&local_48,(this->capa_size_).mask_ + 1,(this->capa_size_).bits_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&(this->ids_).chunks_,&local_48);
  (this->ids_).width_ = local_48.width_;
  (this->ids_).size_ = local_48.size_;
  (this->ids_).mask_ = local_48.mask_;
  if (local_48.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.chunks_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.chunks_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.chunks_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

plain_fkhash_trie(uint32_t capa_bits, uint32_t symb_bits) {
        capa_size_ = size_p2{std::max(min_capa_bits, capa_bits)};
        symb_size_ = size_p2{symb_bits};
        max_size_ = static_cast<uint64_t>(capa_size_.size() * MaxFactor / 100.0);
        table_ = compact_vector{capa_size_.size(), capa_size_.bits() + symb_size_.bits()};
        ids_ = compact_vector{capa_size_.size(), capa_size_.bits()};
    }